

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_data_dictionary_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::
ExtendedDataDictionaryTest_TestNextFreeFidForAnEmptyDataDictionaryIsZero_Test::TestBody
          (ExtendedDataDictionaryTest_TestNextFreeFidForAnEmptyDataDictionaryIsZero_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_b0;
  Message local_a8 [3];
  ExtendableDataDictionary local_90 [104];
  undefined4 local_28;
  int local_24;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  ExtendedDataDictionaryTest_TestNextFreeFidForAnEmptyDataDictionaryIsZero_Test *this_local;
  
  local_24 = 0;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  ExtendableDataDictionary::ExtendableDataDictionary(local_90);
  local_28 = bidfx_public_api::price::pixie::ExtendableDataDictionary::NextFreeFid();
  testing::internal::EqHelper<true>::Compare<int,int>
            (local_20,"0",(int *)"ExtendableDataDictionary().NextFreeFid()",&local_24,&local_28);
  ExtendableDataDictionary::~ExtendableDataDictionary(local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_a8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/extended_data_dictionary_test.cpp"
               ,0xab,message);
    testing::internal::AssertHelper::operator=(&local_b0,local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::Message::~Message(local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST(ExtendedDataDictionaryTest, TestNextFreeFidForAnEmptyDataDictionaryIsZero)
{
    ASSERT_EQ(0, ExtendableDataDictionary().NextFreeFid());
}